

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_StartingBlockSize_Test::TestBody(ArenaTest_StartingBlockSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_220;
  Message local_218;
  uint64_t local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_2;
  Arena custom_arena;
  Message local_148;
  uint64_t local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  ArenaOptions options;
  Message local_f0 [3];
  uint64_t local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  Arena default_arena;
  ArenaTest_StartingBlockSize_Test *this_local;
  
  Arena::Arena((Arena *)&gtest_ar.message_);
  local_cc = 0;
  local_d8 = Arena::SpaceAllocated((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c8,"0","default_arena.SpaceAllocated()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&options.block_dealloc,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6a7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&options.block_dealloc,local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&options.block_dealloc);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  Arena::CreateArray<char>((Arena *)&gtest_ar.message_,1);
  ArenaOptions::ArenaOptions((ArenaOptions *)&gtest_ar_1.message_);
  local_140 = Arena::SpaceAllocated((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_138,"default_arena.SpaceAllocated()","options.start_block_size",
             &local_140,(unsigned_long *)&gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&custom_arena.impl_.first_arena_.cached_blocks_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6ad,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&custom_arena.impl_.first_arena_.cached_blocks_,&local_148);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&custom_arena.impl_.first_arena_.cached_blocks_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl * 2);
  Arena::Arena((Arena *)&gtest_ar_2.message_,(ArenaOptions *)&gtest_ar_1.message_);
  Arena::CreateArray<char>((Arena *)&gtest_ar_2.message_,1);
  local_210 = Arena::SpaceAllocated((Arena *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_208,"custom_arena.SpaceAllocated()","options.start_block_size",
             &local_210,(unsigned_long *)&gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  Arena::~Arena((Arena *)&gtest_ar_2.message_);
  Arena::~Arena((Arena *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ArenaTest, StartingBlockSize) {
  Arena default_arena;
  EXPECT_EQ(0, default_arena.SpaceAllocated());

  // Allocate something to get starting block size.
  Arena::CreateArray<char>(&default_arena, 1);
  ArenaOptions options;
  // First block size should be the default starting block size.
  EXPECT_EQ(default_arena.SpaceAllocated(), options.start_block_size);

  // Use a custom starting block size.
  options.start_block_size *= 2;
  Arena custom_arena(options);
  Arena::CreateArray<char>(&custom_arena, 1);
  EXPECT_EQ(custom_arena.SpaceAllocated(), options.start_block_size);
}